

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::ImportPrivKeys
          (CWallet *this,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,int64_t timestamp)

{
  bool bVar1;
  LegacyScriptPubKeyMan *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyScriptPubKeyMan(this);
  if (this_00 == (LegacyScriptPubKeyMan *)0x0) {
    bVar1 = false;
  }
  else {
    local_30._M_device =
         &(this_00->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.
          super_recursive_mutex;
    local_30._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_30);
    bVar1 = LegacyScriptPubKeyMan::ImportPrivKeys(this_00,privkey_map,timestamp);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::ImportPrivKeys(const std::map<CKeyID, CKey>& privkey_map, const int64_t timestamp)
{
    auto spk_man = GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        return false;
    }
    LOCK(spk_man->cs_KeyStore);
    return spk_man->ImportPrivKeys(privkey_map, timestamp);
}